

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaParseWildcardNs
              (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlSchemaWildcardPtr wildc,
              xmlNodePtr node)

{
  int iVar1;
  xmlChar *pxVar2;
  xmlNodePtr node_00;
  xmlSchemaWildcardNsPtr pxVar3;
  xmlSchemaTypePtr type;
  xmlAttrPtr pxVar4;
  bool bVar5;
  byte *local_80;
  xmlChar *cur;
  xmlChar *end;
  xmlAttrPtr attr;
  xmlSchemaWildcardNsPtr lastNs;
  xmlSchemaWildcardNsPtr tmp;
  xmlChar *nsItem;
  xmlChar *pxStack_48;
  int ret;
  xmlChar *dictnsItem;
  xmlChar *ns;
  xmlChar *pc;
  xmlNodePtr node_local;
  xmlSchemaWildcardPtr wildc_local;
  xmlSchemaPtr schema_local;
  xmlSchemaParserCtxtPtr ctxt_local;
  
  nsItem._4_4_ = 0;
  attr = (xmlAttrPtr)0x0;
  pxVar2 = xmlSchemaGetProp(ctxt,node,"processContents");
  if ((pxVar2 == (xmlChar *)0x0) || (iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"strict"), iVar1 != 0)) {
    wildc->processContents = 3;
  }
  else {
    iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"skip");
    if (iVar1 == 0) {
      iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"lax");
      if (iVar1 == 0) {
        xmlSchemaPSimpleTypeErr
                  (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,(xmlSchemaBasicItemPtr)0x0,node,
                   (xmlSchemaTypePtr)0x0,"(strict | skip | lax)",pxVar2,(char *)0x0,(xmlChar *)0x0,
                   (xmlChar *)0x0);
        wildc->processContents = 3;
        nsItem._4_4_ = 0xbdd;
      }
      else {
        wildc->processContents = 2;
      }
    }
    else {
      wildc->processContents = 1;
    }
  }
  node_00 = (xmlNodePtr)xmlSchemaGetPropNode(node,"namespace");
  local_80 = xmlSchemaGetNodeContent(ctxt,node_00);
  if (local_80 == (byte *)0x0) {
    ctxt_local._4_4_ = -1;
  }
  else {
    if ((node_00 == (xmlNodePtr)0x0) ||
       (iVar1 = xmlStrEqual(local_80,(xmlChar *)"##any"), iVar1 != 0)) {
      wildc->any = 1;
    }
    else {
      iVar1 = xmlStrEqual(local_80,(xmlChar *)"##other");
      if (iVar1 == 0) {
        do {
          while( true ) {
            bVar5 = true;
            if ((*local_80 != 0x20) && ((*local_80 < 9 || (bVar5 = true, 10 < *local_80)))) {
              bVar5 = *local_80 == 0xd;
            }
            if (!bVar5) break;
            local_80 = local_80 + 1;
          }
          cur = local_80;
          while( true ) {
            bVar5 = false;
            if (*cur != '\0') {
              bVar5 = true;
              if ((*cur != ' ') && ((*cur < 9 || (bVar5 = true, 10 < *cur)))) {
                bVar5 = *cur == '\r';
              }
              bVar5 = (bool)(bVar5 ^ 1);
            }
            if (!bVar5) break;
            cur = cur + 1;
          }
          if (cur == local_80) break;
          pxVar2 = xmlStrndup(local_80,(int)cur - (int)local_80);
          iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"##other");
          pxVar4 = attr;
          if ((iVar1 == 0) && (iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"##any"), iVar1 == 0)) {
            iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"##targetNamespace");
            if (iVar1 == 0) {
              iVar1 = xmlStrEqual(pxVar2,(xmlChar *)"##local");
              if (iVar1 == 0) {
                type = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI);
                xmlSchemaPValAttrNodeValue
                          (ctxt,(xmlSchemaBasicItemPtr)0x0,(xmlAttrPtr)node_00,pxVar2,type);
                pxStack_48 = xmlDictLookup(ctxt->dict,pxVar2,-1);
              }
              else {
                pxStack_48 = (xmlChar *)0x0;
              }
            }
            else {
              pxStack_48 = ctxt->targetNamespace;
            }
            for (lastNs = wildc->nsSet;
                (lastNs != (xmlSchemaWildcardNsPtr)0x0 && (pxStack_48 != lastNs->value));
                lastNs = lastNs->next) {
            }
            if (lastNs == (xmlSchemaWildcardNsPtr)0x0) {
              pxVar4 = (xmlAttrPtr)xmlSchemaNewWildcardNsConstraint(ctxt);
              if (pxVar4 == (xmlAttrPtr)0x0) {
                (*xmlFree)(pxVar2);
                return -1;
              }
              *(xmlChar **)&pxVar4->type = pxStack_48;
              pxVar4->_private = (_xmlSchemaWildcardNs *)0x0;
              if (wildc->nsSet == (xmlSchemaWildcardNsPtr)0x0) {
                wildc->nsSet = (xmlSchemaWildcardNsPtr)pxVar4;
              }
              else if (attr != (xmlAttrPtr)0x0) {
                attr->_private = pxVar4;
              }
            }
          }
          else {
            xmlSchemaPSimpleTypeErr
                      (ctxt,XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,(xmlSchemaBasicItemPtr)0x0,
                       node_00,(xmlSchemaTypePtr)0x0,
                       "((##any | ##other) | List of (xs:anyURI | (##targetNamespace | ##local)))",
                       pxVar2,(char *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
            nsItem._4_4_ = 0x700;
          }
          attr = pxVar4;
          (*xmlFree)(pxVar2);
          local_80 = cur;
        } while (*cur != '\0');
      }
      else {
        pxVar3 = xmlSchemaNewWildcardNsConstraint(ctxt);
        wildc->negNsSet = pxVar3;
        if (wildc->negNsSet == (xmlSchemaWildcardNsPtr)0x0) {
          return -1;
        }
        wildc->negNsSet->value = ctxt->targetNamespace;
      }
    }
    ctxt_local._4_4_ = nsItem._4_4_;
  }
  return ctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaParseWildcardNs(xmlSchemaParserCtxtPtr ctxt,
			 xmlSchemaPtr schema ATTRIBUTE_UNUSED,
			 xmlSchemaWildcardPtr wildc,
			 xmlNodePtr node)
{
    const xmlChar *pc, *ns, *dictnsItem;
    int ret = 0;
    xmlChar *nsItem;
    xmlSchemaWildcardNsPtr tmp, lastNs = NULL;
    xmlAttrPtr attr;

    pc = xmlSchemaGetProp(ctxt, node, "processContents");
    if ((pc == NULL)
        || (xmlStrEqual(pc, (const xmlChar *) "strict"))) {
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
    } else if (xmlStrEqual(pc, (const xmlChar *) "skip")) {
        wildc->processContents = XML_SCHEMAS_ANY_SKIP;
    } else if (xmlStrEqual(pc, (const xmlChar *) "lax")) {
        wildc->processContents = XML_SCHEMAS_ANY_LAX;
    } else {
        xmlSchemaPSimpleTypeErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
	    NULL, node,
	    NULL, "(strict | skip | lax)", pc,
	    NULL, NULL, NULL);
        wildc->processContents = XML_SCHEMAS_ANY_STRICT;
	ret = XML_SCHEMAP_S4S_ATTR_INVALID_VALUE;
    }
    /*
     * Build the namespace constraints.
     */
    attr = xmlSchemaGetPropNode(node, "namespace");
    ns = xmlSchemaGetNodeContent(ctxt, (xmlNodePtr) attr);
    if (ns == NULL)
        return (-1);
    if ((attr == NULL) || (xmlStrEqual(ns, BAD_CAST "##any")))
	wildc->any = 1;
    else if (xmlStrEqual(ns, BAD_CAST "##other")) {
	wildc->negNsSet = xmlSchemaNewWildcardNsConstraint(ctxt);
	if (wildc->negNsSet == NULL) {
	    return (-1);
	}
	wildc->negNsSet->value = ctxt->targetNamespace;
    } else {
	const xmlChar *end, *cur;

	cur = ns;
	do {
	    while (IS_BLANK_CH(*cur))
		cur++;
	    end = cur;
	    while ((*end != 0) && (!(IS_BLANK_CH(*end))))
		end++;
	    if (end == cur)
		break;
	    nsItem = xmlStrndup(cur, end - cur);
	    if ((xmlStrEqual(nsItem, BAD_CAST "##other")) ||
		    (xmlStrEqual(nsItem, BAD_CAST "##any"))) {
		xmlSchemaPSimpleTypeErr(ctxt,
		    XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER,
		    NULL, (xmlNodePtr) attr,
		    NULL,
		    "((##any | ##other) | List of (xs:anyURI | "
		    "(##targetNamespace | ##local)))",
		    nsItem, NULL, NULL, NULL);
		ret = XML_SCHEMAP_WILDCARD_INVALID_NS_MEMBER;
	    } else {
		if (xmlStrEqual(nsItem, BAD_CAST "##targetNamespace")) {
		    dictnsItem = ctxt->targetNamespace;
		} else if (xmlStrEqual(nsItem, BAD_CAST "##local")) {
		    dictnsItem = NULL;
		} else {
		    /*
		    * Validate the item (anyURI).
		    */
		    xmlSchemaPValAttrNodeValue(ctxt, NULL, attr,
			nsItem, xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYURI));
		    dictnsItem = xmlDictLookup(ctxt->dict, nsItem, -1);
		}
		/*
		* Avoid duplicate namespaces.
		*/
		tmp = wildc->nsSet;
		while (tmp != NULL) {
		    if (dictnsItem == tmp->value)
			break;
		    tmp = tmp->next;
		}
		if (tmp == NULL) {
		    tmp = xmlSchemaNewWildcardNsConstraint(ctxt);
		    if (tmp == NULL) {
			xmlFree(nsItem);
			return (-1);
		    }
		    tmp->value = dictnsItem;
		    tmp->next = NULL;
		    if (wildc->nsSet == NULL)
			wildc->nsSet = tmp;
		    else if (lastNs != NULL)
			lastNs->next = tmp;
		    lastNs = tmp;
		}

	    }
	    xmlFree(nsItem);
	    cur = end;
	} while (*cur != 0);
    }
    return (ret);
}